

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_id.cc
# Opt level: O1

bool __thiscall Env::GetConstant(Env *this,ID *id,int *pc)

{
  IDRecord *pIVar1;
  char cVar2;
  
  cVar2 = '\0';
  pIVar1 = lookup(this,id,true,false);
  if ((pIVar1 != (IDRecord *)0x0) && (cVar2 = pIVar1->constant_set, (bool)cVar2 == true)) {
    *pc = pIVar1->constant;
  }
  return (bool)cVar2;
}

Assistant:

bool Env::GetConstant(const ID* id, int* pc) const
	{
	ASSERT(pc);
	// lookup without raising exception
	IDRecord* r = lookup(id, true, false);
	if ( r )
		return r->GetConstant(pc);
	else
		return false;
	}